

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

U32 ZSTD_litLengthPrice(U32 litLength,optState_t *optPtr,int optLevel)

{
  int iVar1;
  U32 UVar2;
  U32 UVar3;
  
  if (optPtr->priceType != zop_predef) {
    UVar3 = ZSTD_LLcode(litLength);
    iVar1 = *(int *)((long)LL_bits + (ulong)(UVar3 << 2));
    UVar2 = optPtr->litLengthSumBasePrice;
    UVar3 = *(U32 *)((long)optPtr->litLengthFreq + (ulong)(UVar3 << 2));
    if (optLevel == 0) {
      UVar3 = ZSTD_bitWeight(UVar3);
    }
    else {
      UVar3 = ZSTD_fracWeight(UVar3);
    }
    return (iVar1 * 0x100 + UVar2) - UVar3;
  }
  if (optLevel != 0) {
    UVar2 = ZSTD_fracWeight(litLength);
    return UVar2;
  }
  UVar2 = ZSTD_bitWeight(litLength);
  return UVar2;
}

Assistant:

static U32 ZSTD_litLengthPrice(U32 const litLength, const optState_t* const optPtr, int optLevel)
{
    if (optPtr->priceType == zop_predef) return WEIGHT(litLength, optLevel);

    /* dynamic statistics */
    {   U32 const llCode = ZSTD_LLcode(litLength);
        return (LL_bits[llCode] * BITCOST_MULTIPLIER)
             + optPtr->litLengthSumBasePrice
             - WEIGHT(optPtr->litLengthFreq[llCode], optLevel);
    }
}